

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_group_scrolled_offset_begin
              (nk_context *ctx,nk_uint *x_offset,nk_uint *y_offset,char *title,nk_flags flags)

{
  uint uVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  undefined8 uVar4;
  char *local_248;
  nk_flags f;
  nk_rect *c;
  nk_window *win;
  nk_window panel;
  float fStack_40;
  nk_rect bounds;
  nk_flags flags_local;
  char *title_local;
  nk_uint *y_offset_local;
  nk_uint *x_offset_local;
  nk_context *ctx_local;
  
  pnVar2 = ctx->current;
  nk_panel_alloc_space((nk_rect *)((long)&panel.parent + 4),ctx);
  pnVar3 = pnVar2->layout;
  if ((((((pnVar3->clip).x + (pnVar3->clip).w < panel.parent._4_4_) ||
        (panel.parent._4_4_ + bounds.x < (pnVar3->clip).x)) ||
       ((pnVar3->clip).y + (pnVar3->clip).h < fStack_40)) ||
      (fStack_40 + bounds.y < (pnVar3->clip).y)) && ((flags & 2) == 0)) {
    return 0;
  }
  bounds.w = (float)flags;
  if ((pnVar2->flags & 0x1000) != 0) {
    bounds.w = (float)(flags | 0x1000);
  }
  nk_zero(&win,0x1d8);
  panel.name_string._56_4_ = bounds.w;
  panel.bounds.w = (float)*x_offset;
  panel.bounds.h = (float)*y_offset;
  memcpy(&panel.scrollbar.y,&pnVar2->buffer,0x40);
  panel.buffer.last = (nk_size)nk_create_panel(ctx);
  ctx->current = (nk_window *)&win;
  local_248 = title;
  if (((uint)bounds.w & 0x40) == 0) {
    local_248 = (char *)0x0;
  }
  nk_panel_begin(ctx,local_248,NK_PANEL_GROUP);
  memcpy(&pnVar2->buffer,&panel.scrollbar.y,0x40);
  uVar4 = *(undefined8 *)(panel.buffer.last + 0x44);
  (pnVar2->buffer).clip.x = (float)(int)uVar4;
  (pnVar2->buffer).clip.y = (float)(int)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(panel.buffer.last + 0x4c);
  (pnVar2->buffer).clip.w = (float)(int)uVar4;
  (pnVar2->buffer).clip.h = (float)(int)((ulong)uVar4 >> 0x20);
  *(nk_uint **)(panel.buffer.last + 0x18) = x_offset;
  *(nk_uint **)(panel.buffer.last + 0x20) = y_offset;
  *(nk_panel **)(panel.buffer.last + 0x1b8) = pnVar2->layout;
  pnVar2->layout = (nk_panel *)panel.buffer.last;
  ctx->current = pnVar2;
  if (((*(uint *)(panel.buffer.last + 4) & 0x4000) != 0) ||
     ((*(uint *)(panel.buffer.last + 4) & 0x8000) != 0)) {
    uVar1 = *(uint *)(panel.buffer.last + 4);
    nk_group_scrolled_end(ctx);
    if ((uVar1 & 0x4000) != 0) {
      return 0x4000;
    }
    if ((uVar1 & 0x8000) != 0) {
      return 0x8000;
    }
  }
  return 1;
}

Assistant:

NK_API int
nk_group_scrolled_offset_begin(struct nk_context *ctx,
    nk_uint *x_offset, nk_uint *y_offset, const char *title, nk_flags flags)
{
    struct nk_rect bounds;
    struct nk_window panel;
    struct nk_window *win;

    win = ctx->current;
    nk_panel_alloc_space(&bounds, ctx);
    {const struct nk_rect *c = &win->layout->clip;
    if (!NK_INTERSECT(c->x, c->y, c->w, c->h, bounds.x, bounds.y, bounds.w, bounds.h) &&
        !(flags & NK_WINDOW_MOVABLE)) {
        return 0;
    }}
    if (win->flags & NK_WINDOW_ROM)
        flags |= NK_WINDOW_ROM;

    /* initialize a fake window to create the panel from */
    nk_zero(&panel, sizeof(panel));
    panel.bounds = bounds;
    panel.flags = flags;
    panel.scrollbar.x = *x_offset;
    panel.scrollbar.y = *y_offset;
    panel.buffer = win->buffer;
    panel.layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = &panel;
    nk_panel_begin(ctx, (flags & NK_WINDOW_TITLE) ? title: 0, NK_PANEL_GROUP);

    win->buffer = panel.buffer;
    win->buffer.clip = panel.layout->clip;
    panel.layout->offset_x = x_offset;
    panel.layout->offset_y = y_offset;
    panel.layout->parent = win->layout;
    win->layout = panel.layout;

    ctx->current = win;
    if ((panel.layout->flags & NK_WINDOW_CLOSED) ||
        (panel.layout->flags & NK_WINDOW_MINIMIZED))
    {
        nk_flags f = panel.layout->flags;
        nk_group_scrolled_end(ctx);
        if (f & NK_WINDOW_CLOSED)
            return NK_WINDOW_CLOSED;
        if (f & NK_WINDOW_MINIMIZED)
            return NK_WINDOW_MINIMIZED;
    }
    return 1;
}